

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# common.h
# Opt level: O0

Maybe<unsigned_int> __thiscall
kj::parse::Many_<kj::parse::ConstResult_<kj::parse::CharGroup_,_kj::_::Tuple<>_>,_false>::
Impl<capnp::compiler::Lexer::ParserInput,_kj::_::Tuple<>_>::apply
          (Impl<capnp::compiler::Lexer::ParserInput,_kj::_::Tuple<>_> *this,
          ConstResult_<kj::parse::CharGroup_,_kj::_::Tuple<>_> *subParser,ParserInput *input)

{
  bool bVar1;
  int local_6c;
  Maybe<kj::_::Tuple<>_> local_52;
  undefined1 local_50 [8];
  ParserInput subInput;
  uint count;
  ParserInput *input_local;
  ConstResult_<kj::parse::CharGroup_,_kj::_::Tuple<>_> *subParser_local;
  
  subInput.begin._4_4_ = 0;
  do {
    bVar1 = IteratorInput<char,_const_char_*>::atEnd
                      (&input->super_IteratorInput<char,_const_char_*>);
    if (((bVar1 ^ 0xffU) & 1) == 0) break;
    capnp::compiler::Lexer::ParserInput::ParserInput((ParserInput *)local_50,input);
    ConstResult_<kj::parse::CharGroup_,kj::_::Tuple<>>::operator()
              ((ConstResult_<kj::parse::CharGroup_,kj::_::Tuple<>> *)&local_52,
               (ParserInput *)subParser);
    bVar1 = Maybe<kj::_::Tuple<>_>::operator==(&local_52);
    Maybe<kj::_::Tuple<>_>::~Maybe(&local_52);
    if (((bVar1 ^ 0xffU) & 1) == 0) {
      local_6c = 3;
    }
    else {
      IteratorInput<char,_const_char_*>::advanceParent
                ((IteratorInput<char,_const_char_*> *)local_50);
      subInput.begin._4_4_ = subInput.begin._4_4_ + 1;
      local_6c = 0;
    }
    capnp::compiler::Lexer::ParserInput::~ParserInput((ParserInput *)local_50);
  } while (local_6c == 0);
  Maybe<unsigned_int>::Maybe((Maybe<unsigned_int> *)this,(uint *)((long)&subInput.begin + 4));
  return (Maybe<unsigned_int>)(NullableValue<unsigned_int>)this;
}

Assistant:

static Maybe<uint> apply(const SubParser& subParser, Input& input) {
    uint count = 0;

    while (!input.atEnd()) {
      Input subInput(input);

      if (kj::none != subParser(subInput)) {
        subInput.advanceParent();
        ++count;
      } else {
        break;
      }
    }

    if (atLeastOne && count == 0) {
      return kj::none;
    }

    return count;
  }